

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroupSegmentTree::LoadSegment(RowGroupSegmentTree *this)

{
  long *plVar1;
  type stream;
  long in_RSI;
  RowGroupPointer row_group_pointer;
  BinaryDeserializer deserializer;
  RowGroupPointer RStack_2e8;
  BinaryDeserializer local_2a8;
  
  if (*(ulong *)(in_RSI + 0x58) < *(ulong *)(in_RSI + 0x60)) {
    stream = unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>,_true>::
             operator*((unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>,_true>
                        *)(in_RSI + 0x68));
    BinaryDeserializer::BinaryDeserializer(&local_2a8,&stream->super_ReadStream);
    BinaryDeserializer::OnObjectBegin(&local_2a8);
    RowGroup::Deserialize(&RStack_2e8,&local_2a8.super_Deserializer);
    BinaryDeserializer::OnObjectEnd(&local_2a8);
    *(long *)(in_RSI + 0x58) = *(long *)(in_RSI + 0x58) + 1;
    make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,duckdb::RowGroupPointer>
              ((duckdb *)this,*(RowGroupCollection **)(in_RSI + 0x50),&RStack_2e8);
    RowGroupPointer::~RowGroupPointer(&RStack_2e8);
    Deserializer::~Deserializer(&local_2a8.super_Deserializer);
  }
  else {
    plVar1 = *(long **)(in_RSI + 0x68);
    *(undefined8 *)(in_RSI + 0x68) = 0;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    LOCK();
    *(undefined1 *)(in_RSI + 8) = 1;
    UNLOCK();
    (this->super_SegmentTree<duckdb::RowGroup,_true>)._vptr_SegmentTree = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroupSegmentTree::LoadSegment() {
	if (current_row_group >= max_row_group) {
		reader.reset();
		finished_loading = true;
		return nullptr;
	}
	BinaryDeserializer deserializer(*reader);
	deserializer.Begin();
	auto row_group_pointer = RowGroup::Deserialize(deserializer);
	deserializer.End();
	current_row_group++;
	return make_uniq<RowGroup>(collection, std::move(row_group_pointer));
}